

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

void __thiscall rtc::Event::Event(Event *this,bool manual_reset,bool initially_signaled)

{
  int iVar1;
  ostream *poVar2;
  FatalMessage local_320;
  FatalMessageVoidify local_1a5 [20];
  byte local_191;
  FatalMessage local_190;
  FatalMessageVoidify local_13;
  undefined1 local_12;
  undefined1 local_11;
  bool initially_signaled_local;
  Event *pEStack_10;
  bool manual_reset_local;
  Event *this_local;
  
  this->is_manual_reset_ = manual_reset;
  this->event_status_ = initially_signaled;
  local_12 = initially_signaled;
  local_11 = manual_reset;
  pEStack_10 = this;
  iVar1 = pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)0x0);
  local_191 = 0;
  if (iVar1 != 0) {
    FatalMessageVoidify::FatalMessageVoidify(&local_13);
    FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/event.cc"
               ,0x3b);
    local_191 = 1;
    poVar2 = FatalMessage::stream(&local_190);
    poVar2 = std::operator<<(poVar2,"Check failed: pthread_mutex_init(&event_mutex_, NULL) == 0");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"# ");
    FatalMessageVoidify::operator&(&local_13,poVar2);
  }
  if ((local_191 & 1) != 0) {
    FatalMessage::~FatalMessage(&local_190);
  }
  iVar1 = pthread_cond_init((pthread_cond_t *)&this->event_cond_,(pthread_condattr_t *)0x0);
  if (iVar1 != 0) {
    FatalMessageVoidify::FatalMessageVoidify(local_1a5);
    FatalMessage::FatalMessage
              (&local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/event.cc"
               ,0x3c);
    poVar2 = FatalMessage::stream(&local_320);
    poVar2 = std::operator<<(poVar2,"Check failed: pthread_cond_init(&event_cond_, NULL) == 0");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"# ");
    FatalMessageVoidify::operator&(local_1a5,poVar2);
    FatalMessage::~FatalMessage(&local_320);
  }
  return;
}

Assistant:

Event::Event(bool manual_reset, bool initially_signaled)
    : is_manual_reset_(manual_reset),
      event_status_(initially_signaled) {
  RTC_CHECK(pthread_mutex_init(&event_mutex_, NULL) == 0);
  RTC_CHECK(pthread_cond_init(&event_cond_, NULL) == 0);
}